

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

time_t get_time(int ttime)

{
  time_t tVar1;
  uint in_EDI;
  tm tm;
  tm local_40;
  
  local_40.tm_sec = (in_EDI & 0x1f) << 1;
  local_40.tm_min = (int)in_EDI >> 5 & 0x3f;
  local_40.tm_hour = (int)in_EDI >> 0xb & 0x1f;
  local_40.tm_mday = (int)in_EDI >> 0x10 & 0x1f;
  local_40.tm_mon = ((int)in_EDI >> 0x15 & 0xfU) - 1;
  local_40.tm_year = ((int)in_EDI >> 0x19 & 0x7fU) + 0x50;
  local_40.tm_isdst = -1;
  tVar1 = mktime(&local_40);
  return tVar1;
}

Assistant:

static time_t
get_time(int ttime)
{
  struct tm tm;
  tm.tm_sec = 2 * (ttime & 0x1f);
  tm.tm_min = (ttime >> 5) & 0x3f;
  tm.tm_hour = (ttime >> 11) & 0x1f;
  tm.tm_mday = (ttime >> 16) & 0x1f;
  tm.tm_mon = ((ttime >> 21) & 0x0f) - 1;
  tm.tm_year = ((ttime >> 25) & 0x7f) + 80;
  tm.tm_isdst = -1;
  return mktime(&tm);
}